

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Version * google::protobuf::Arena::CreateMessageInternal<google::protobuf::compiler::Version>
                    (Arena *arena)

{
  Version *pVVar1;
  
  if (arena == (Arena *)0x0) {
    pVVar1 = (Version *)operator_new(0x30);
    (pVVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__MessageLite_004e16b0;
    (pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = 0;
  }
  else {
    pVVar1 = (Version *)
             AllocateAlignedWithHook(arena,0x30,(type_info *)&compiler::Version::typeinfo);
    (pVVar1->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__MessageLite_004e16b0;
    (pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)arena;
  }
  (pVVar1->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Version_004ddf70
  ;
  pVVar1->_has_bits_ = (uint32_t  [1])0x0;
  pVVar1->_cached_size_ = (atomic<int>)0x0;
  (pVVar1->suffix_).tagged_ptr_.ptr_ = &internal::fixed_address_empty_string_abi_cxx11_;
  pVVar1->major_ = 0;
  pVVar1->minor_ = 0;
  pVVar1->patch_ = 0;
  return pVVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }